

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O2

void GradientFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  long lVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *local_48;
  
  *filtered_data = *data;
  PredictLine_C(data + 1,data,filtered_data + 1,width + -1);
  puVar6 = filtered_data + stride;
  puVar5 = data + stride;
  local_48 = filtered_data;
  for (iVar2 = 1; iVar2 < height; iVar2 = iVar2 + 1) {
    local_48 = local_48 + stride;
    PredictLine_C(data + stride,data,local_48,1);
    for (lVar1 = 1; lVar1 < width; lVar1 = lVar1 + 1) {
      iVar4 = ((uint)data[lVar1] + (uint)puVar5[lVar1 + -1]) - (uint)data[lVar1 + -1];
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      cVar3 = (char)iVar4;
      if (0xfe < iVar4) {
        cVar3 = -1;
      }
      puVar6[lVar1] = puVar5[lVar1] - cVar3;
    }
    puVar6 = puVar6 + stride;
    puVar5 = puVar5 + stride;
    data = data + stride;
  }
  return;
}

Assistant:

static void GradientFilter_C(const uint8_t* WEBP_RESTRICT data,
                             int width, int height, int stride,
                             uint8_t* WEBP_RESTRICT filtered_data) {
  DoGradientFilter_C(data, width, height, stride, filtered_data);
}